

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O2

string * __thiscall
Assimp::LWSImporter::FindLWOFile(string *__return_storage_ptr__,LWSImporter *this,string *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char __lhs;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar6 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar6;
  if ((((in->_M_string_length < 4) || (pcVar2 = (in->_M_dataplus)._M_p, pcVar2[1] != ':')) ||
      (pcVar2[2] == '/')) || (pcVar2[2] == '\\')) {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  else {
    __lhs = *pcVar2;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,":\\",&local_d1);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)in);
    std::operator+(&local_90,&local_b0,&local_50);
    std::operator+(&local_d0,__lhs,&local_90);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  iVar4 = (*this->io->_vptr_IOSystem[2])(this->io,local_70._M_dataplus._M_p);
  if ((char)iVar4 != '\0') {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)in);
    goto LAB_004144e5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"..",(allocator<char> *)&local_50);
  iVar4 = (*this->io->_vptr_IOSystem[3])();
  std::operator+(&local_b0,(char)iVar4,&local_70);
  std::operator+(&local_d0,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  iVar4 = (*this->io->_vptr_IOSystem[2])(this->io,local_d0._M_dataplus._M_p);
  if ((char)iVar4 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"..",&local_d1);
    iVar4 = (*this->io->_vptr_IOSystem[3])();
    std::operator+(&local_50,(char)iVar4,&local_d0);
    std::operator+(&local_90,&local_b0,&local_50);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    iVar4 = (*this->io->_vptr_IOSystem[2])(this->io,local_d0._M_dataplus._M_p);
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    if ((char)iVar4 != '\0') {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_d0._M_dataplus._M_p;
        goto LAB_004143d8;
      }
      paVar1->_M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d0.field_2._8_8_;
      goto LAB_004144b3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar6) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    }
    pbVar3 = &local_70;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_d0.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d0._M_dataplus._M_p;
LAB_004143d8:
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_d0.field_2._M_allocated_capacity;
    }
LAB_004144b3:
    paVar6 = &local_d0.field_2;
    pbVar3 = &local_d0;
  }
  psVar5 = &pbVar3->_M_string_length;
  __return_storage_ptr__->_M_string_length = *psVar5;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar5 + -1))->_M_dataplus
  )._M_p = (pointer)paVar6;
  *psVar5 = 0;
  paVar6->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_d0);
LAB_004144e5:
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string LWSImporter::FindLWOFile(const std::string& in)
{
    // insert missing directory separator if necessary
    std::string tmp;
    if (in.length() > 3 && in[1] == ':'&& in[2] != '\\' && in[2] != '/')
    {
        tmp = in[0] + (std::string(":\\") + in.substr(2));
    }
    else tmp = in;

    if (io->Exists(tmp)) {
        return in;
    }

    // file is not accessible for us ... maybe it's packed by
    // LightWave's 'Package Scene' command?

    // Relevant for us are the following two directories:
    // <folder>\Objects\<hh>\<*>.lwo
    // <folder>\Scenes\<hh>\<*>.lws
    // where <hh> is optional.

    std::string test = std::string("..") + (io->getOsSeparator() + tmp);
    if (io->Exists(test)) {
        return test;
    }

    test = std::string("..") + (io->getOsSeparator() + test);
    if (io->Exists(test)) {
        return test;
    }


    // return original path, maybe the IOsystem knows better
    return tmp;
}